

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O1

bool chrono::utils::AddTriangleMeshConvexDecompositionSplit
               (ChSystem *system,shared_ptr<chrono::ChMaterialSurface> *material,
               string *obj_filename,string *name,ChVector<double> *pos,ChQuaternion<double> *rot,
               double total_mass)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  _func_int *p_Var5;
  element_type *peVar6;
  double dVar7;
  double dVar8;
  ChVisualModel *this;
  undefined8 this_00;
  char cVar9;
  int iVar10;
  int iVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined4 extraout_var;
  double *pdVar12;
  ostream *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  ChTriangleMeshShape *pCVar14;
  _func_int **pp_Var15;
  long lVar16;
  bool bVar17;
  shared_ptr<chrono::ChVisualModel> *model;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> convexhull;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  double mass;
  ChVector<double> center;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  ChConvexDecompositionHACDv2 mydecompositionHACDv2;
  ChMatrix33<double> inertia;
  ChTriangleMeshConnected trimesh_convex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_458;
  void *local_448;
  long lStack_440;
  long local_438;
  ChTriangleMeshShape *local_430;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_428;
  double local_420;
  int local_414;
  ChVector<double> *local_410;
  ChQuaternion<double> *local_408;
  ChSystem *local_400;
  ChGeometry local_3f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3f0;
  shared_ptr<chrono::ChVisualShape> local_3e8;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_3d8;
  shared_ptr<chrono::ChVisualModel> local_3c8;
  element_type *local_3b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3b0;
  ChVector<double> local_3a8;
  double local_388;
  pointer local_380;
  _func_int **local_378;
  _func_int **local_370;
  _func_int **local_368;
  double local_360;
  string *local_358;
  shared_ptr<chrono::ChMaterialSurface> *local_350;
  ChVisualModel *local_348;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_340;
  undefined1 local_338 [24];
  pointer local_320;
  ChVector<double> CStack_318;
  pointer local_300;
  pointer pCStack_2f8;
  pointer local_2f0;
  ChMatrix33<double> local_2e8;
  ChConvexDecompositionHACDv2 local_2a0;
  ChQuaternion<double> local_220;
  ChMatrix33<double> local_200;
  undefined1 local_1b8 [16];
  pointer pCStack_1a8;
  pointer pCStack_1a0;
  pointer pCStack_198;
  pointer pCStack_190;
  pointer pCStack_188;
  pointer pCStack_180;
  pointer pCStack_178;
  pointer local_170;
  pointer pCStack_168;
  pointer pCStack_160;
  pointer pCStack_158;
  pointer pCStack_150;
  pointer pCStack_148;
  pointer pCStack_140;
  pointer pCStack_138;
  pointer pCStack_130;
  pointer pCStack_128;
  pointer pCStack_120;
  pointer local_118;
  pointer pCStack_110;
  pointer pCStack_108;
  pointer pCStack_100;
  pointer pCStack_f8;
  pointer piStack_f0;
  pointer piStack_e8;
  pointer piStack_e0;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [9];
  
  local_360 = total_mass;
  local_358 = name;
  local_350 = material;
  iVar10 = (*((material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->_vptr_ChMaterialSurface[3])();
  local_400 = system;
  iVar11 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                     (system);
  if (iVar10 != iVar11) {
    __assert_fail("material->GetContactMethod() == system->GetContactMethod()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/utils/ChUtilsCreators.cpp"
                  ,399,
                  "bool chrono::utils::AddTriangleMeshConvexDecompositionSplit(ChSystem *, std::shared_ptr<ChMaterialSurface>, const std::string &, const std::string &, const ChVector<> &, const ChQuaternion<> &, double)"
                 );
  }
  bVar17 = false;
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)local_338,obj_filename,true,false);
  if ((ChTriangleMesh *)local_338._0_8_ != (ChTriangleMesh *)0x0) {
    lVar16 = (long)(((ChTriangleMesh *)(local_338._0_8_ + 0x10))->super_ChGeometry)._vptr_ChGeometry
             - (long)(((ChTriangleMesh *)(local_338._0_8_ + 8))->super_ChGeometry)._vptr_ChGeometry;
    if (lVar16 != 0) {
      lVar16 = (lVar16 >> 3) * -0x5555555555555555;
      lVar16 = lVar16 + (ulong)(lVar16 == 0);
      pp_Var15 = (((ChTriangleMesh *)(local_338._0_8_ + 8))->super_ChGeometry)._vptr_ChGeometry + 2;
      auVar18 = ZEXT816(0xbff0000000000000);
      auVar19 = ZEXT816(0x4000000000000000);
      do {
        dVar1 = rot->m_data[0];
        dVar2 = rot->m_data[1];
        dVar7 = dVar1 * dVar1;
        dVar3 = rot->m_data[2];
        dVar4 = rot->m_data[3];
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar7 + dVar2 * dVar2;
        auVar24 = vfmadd213sd_fma(auVar24,auVar19,auVar18);
        dVar8 = dVar2 * dVar3 - dVar4 * dVar1;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = pp_Var15[-2];
        p_Var5 = pp_Var15[-1];
        auVar29._8_8_ = 0;
        auVar29._0_8_ = (double)p_Var5 * (dVar8 + dVar8);
        auVar24 = vfmadd231sd_fma(auVar29,auVar30,auVar24);
        dVar8 = dVar1 * dVar3 + dVar4 * dVar2;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *pp_Var15;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar8 + dVar8;
        auVar24 = vfmadd213sd_fma(auVar25,auVar31,auVar24);
        dVar8 = dVar2 * dVar3 + dVar4 * dVar1;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dVar7 + dVar3 * dVar3;
        auVar25 = vfmadd213sd_fma(auVar27,auVar19,auVar18);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar8 + dVar8;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = (double)p_Var5 * auVar25._0_8_;
        auVar25 = vfmadd231sd_fma(auVar28,auVar30,auVar20);
        dVar8 = dVar4 * dVar3 - dVar1 * dVar2;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar8 + dVar8;
        auVar25 = vfmadd213sd_fma(auVar21,auVar31,auVar25);
        dVar8 = dVar4 * dVar2 - dVar1 * dVar3;
        dVar1 = dVar1 * dVar2 + dVar4 * dVar3;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar8 + dVar8;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = (double)p_Var5 * (dVar1 + dVar1);
        auVar21 = vfmadd231sd_fma(auVar26,auVar30,auVar22);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar4 * dVar4 + dVar7;
        auVar20 = vfmadd213sd_fma(auVar23,auVar19,auVar18);
        auVar20 = vfmadd213sd_fma(auVar20,auVar31,auVar21);
        dVar1 = pos->m_data[1];
        dVar2 = pos->m_data[2];
        pp_Var15[-2] = (_func_int *)(auVar24._0_8_ + pos->m_data[0]);
        pp_Var15[-1] = (_func_int *)(auVar25._0_8_ + dVar1);
        *pp_Var15 = (_func_int *)(auVar20._0_8_ + dVar2);
        pp_Var15 = pp_Var15 + 3;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    collision::ChConvexDecompositionHACDv2::ChConvexDecompositionHACDv2(&local_2a0);
    collision::ChConvexDecompositionHACDv2::Reset(&local_2a0);
    collision::ChConvexDecompositionHACDv2::AddTriangleMesh
              (&local_2a0,(ChTriangleMesh *)local_338._0_8_);
    collision::ChConvexDecompositionHACDv2::SetParameters
              (&local_2a0,0x400,0x100,0x40,0.01,0.1,1e-06);
    collision::ChConvexDecompositionHACDv2::ComputeConvexDecomposition(&local_2a0);
    iVar10 = (*local_2a0.super_ChConvexDecomposition._vptr_ChConvexDecomposition[7])();
    local_3a8.m_data[0] = 0.0;
    local_3a8.m_data[1] = 0.0;
    local_3a8.m_data[2] = 0.0;
    bVar17 = 0 < iVar10;
    local_410 = pos;
    local_408 = rot;
    if (iVar10 < 1) {
      local_458 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_458 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      iVar11 = 0;
      do {
        local_1b8._0_8_ = &PTR__ChTriangleMeshConnected_00b669b8;
        piStack_f0 = (pointer)0x0;
        piStack_e8 = (pointer)0x0;
        piStack_e0 = (pointer)0x0;
        pCStack_130 = (pointer)0x0;
        pCStack_128 = (pointer)0x0;
        pCStack_120 = (pointer)0x0;
        local_118 = (pointer)0x0;
        pCStack_110 = (pointer)0x0;
        pCStack_108 = (pointer)0x0;
        pCStack_100 = (pointer)0x0;
        pCStack_f8 = (pointer)0x0;
        local_170 = (pointer)0x0;
        pCStack_168 = (pointer)0x0;
        pCStack_160 = (pointer)0x0;
        pCStack_158 = (pointer)0x0;
        pCStack_150 = (pointer)0x0;
        pCStack_148 = (pointer)0x0;
        pCStack_140 = (pointer)0x0;
        pCStack_138 = (pointer)0x0;
        local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pCStack_1a8 = (pointer)0x0;
        pCStack_1a0 = (pointer)0x0;
        pCStack_198 = (pointer)0x0;
        pCStack_190 = (pointer)0x0;
        pCStack_188 = (pointer)0x0;
        pCStack_180 = (pointer)0x0;
        pCStack_178 = (pointer)0x0;
        local_d8._M_p = (pointer)local_c8;
        local_d0 = 0;
        local_c8[0]._M_local_buf[0] = '\0';
        cVar9 = (*local_2a0.super_ChConvexDecomposition._vptr_ChConvexDecomposition[8])
                          (&local_2a0,iVar11,(ChTriangleMeshConnected *)local_1b8);
        if (cVar9 != '\0') {
          geometry::ChTriangleMeshConnected::ComputeMassProperties
                    ((ChTriangleMeshConnected *)local_1b8,true,&local_420,&local_3a8,&local_200);
          local_458 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((double)local_458 + local_420);
        }
        geometry::ChTriangleMeshConnected::~ChTriangleMeshConnected
                  ((ChTriangleMeshConnected *)local_1b8);
        if (cVar9 == '\0') break;
        iVar11 = iVar11 + 1;
        bVar17 = iVar11 < iVar10;
      } while (iVar11 != iVar10);
    }
    if (bVar17) {
      local_458 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      bVar17 = false;
    }
    else {
      bVar17 = iVar10 < 1;
      if (iVar10 < 1) {
        local_458 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_388 = 1.0 / (double)local_458;
        local_368 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b66ac8;
        local_370 = (_func_int **)&PTR__ChTriangleMeshConnected_00b669b8;
        local_378 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b33b18;
        local_380 = (pointer)&PTR__ChFrame_00b2b308;
        iVar11 = 0;
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_414 = iVar10;
        do {
          this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x110);
          this_01->_M_use_count = 1;
          this_01->_M_weak_count = 1;
          this_01->_vptr__Sp_counted_base = local_368;
          this_01[1]._vptr__Sp_counted_base = local_370;
          this_01[1]._M_use_count = 0;
          this_01[1]._M_weak_count = 0;
          this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_01[2]._M_use_count = 0;
          this_01[2]._M_weak_count = 0;
          this_01[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_01[3]._M_use_count = 0;
          this_01[3]._M_weak_count = 0;
          this_01[4]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_01[4]._M_use_count = 0;
          this_01[4]._M_weak_count = 0;
          this_01[5]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_01[5]._M_use_count = 0;
          this_01[5]._M_weak_count = 0;
          this_01[6]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_01[6]._M_use_count = 0;
          this_01[6]._M_weak_count = 0;
          this_01[7]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_01[7]._M_use_count = 0;
          this_01[7]._M_weak_count = 0;
          this_01[8]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_01[8]._M_use_count = 0;
          this_01[8]._M_weak_count = 0;
          this_01[9]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_01[9]._M_use_count = 0;
          this_01[9]._M_weak_count = 0;
          this_01[10]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_01[10]._M_use_count = 0;
          this_01[10]._M_weak_count = 0;
          this_01[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_01[0xb]._M_use_count = 0;
          this_01[0xb]._M_weak_count = 0;
          this_01[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_01[0xc]._M_use_count = 0;
          this_01[0xc]._M_weak_count = 0;
          this_01[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_01[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_01[0xb]._M_use_count = 0;
          this_01[0xb]._M_weak_count = 0;
          this_01[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_01[0xc]._M_use_count = 0;
          this_01[0xc]._M_weak_count = 0;
          this_01[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_01[0xd]._M_use_count = 0;
          this_01[0xd]._M_weak_count = 0;
          this_01[0xe]._vptr__Sp_counted_base = (_func_int **)0x0;
          this_01[0xe]._M_use_count = 0;
          this_01[0xe]._M_weak_count = 0;
          this_01[0xf]._vptr__Sp_counted_base = (_func_int **)(this_01 + 0x10);
          this_01[0xf]._M_use_count = 0;
          this_01[0xf]._M_weak_count = 0;
          *(undefined1 *)&this_01[0x10]._vptr__Sp_counted_base = 0;
          cVar9 = (*local_2a0.super_ChConvexDecomposition._vptr_ChConvexDecomposition[8])
                            (&local_2a0,iVar11);
          local_458 = p_Var13;
          if (cVar9 == '\0') {
LAB_0093de00:
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
LAB_0093de08:
            bVar17 = false;
            goto LAB_0093de0f;
          }
          geometry::ChTriangleMeshConnected::ComputeMassProperties
                    ((ChTriangleMeshConnected *)(this_01 + 1),true,&local_420,&local_3a8,&local_200)
          ;
          local_1b8._0_4_ =
               (*(local_400->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x30])
                         ();
          local_1b8._4_4_ = extraout_var;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8),
                     (ChBody *)local_1b8._0_8_);
          local_458 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
          this_00 = local_1b8._0_8_;
          local_1b8._0_8_ = (_func_int **)0x0;
          local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
          }
          ChVariablesBodyOwnMass::SetBodyMass((ChVariablesBodyOwnMass *)(this_00 + 0x260),local_420)
          ;
          if ((ChCoordsys<double> *)(this_00 + 0x80) != (ChCoordsys<double> *)local_410) {
            (((ChCoordsys<double> *)(this_00 + 0x80))->pos).m_data[0] = local_410->m_data[0];
            *(double *)(this_00 + 0x88) = local_410->m_data[1];
            *(double *)(this_00 + 0x90) = local_410->m_data[2];
          }
          ChFrame<double>::SetRot((ChFrame<double> *)(this_00 + 0x78),local_408);
          ChBody::SetCollide((ChBody *)this_00,true);
          ChBody::SetBodyFixed((ChBody *)this_00,false);
          local_448 = (void *)0x0;
          lStack_440 = 0;
          local_438 = 0;
          cVar9 = (**(code **)((pointer)
                              (local_2a0.super_ChConvexDecomposition._vptr_ChConvexDecomposition + 9
                              ))->m_data)(&local_2a0,iVar11,&local_448);
          if (cVar9 == '\0') {
            if (local_448 != (void *)0x0) {
              operator_delete(local_448,local_438 - (long)local_448);
            }
            goto LAB_0093de00;
          }
          if (lStack_440 - (long)local_448 != 0) {
            lVar16 = (lStack_440 - (long)local_448 >> 3) * -0x5555555555555555;
            lVar16 = lVar16 + (ulong)(lVar16 == 0);
            pdVar12 = (double *)((long)local_448 + 0x10);
            do {
              pdVar12[-2] = pdVar12[-2] - local_3a8.m_data[0];
              pdVar12[-1] = pdVar12[-1] - local_3a8.m_data[1];
              *pdVar12 = *pdVar12 - local_3a8.m_data[2];
              pdVar12 = pdVar12 + 3;
              lVar16 = lVar16 + -1;
            } while (lVar16 != 0);
          }
          peVar6 = (((shared_ptr<chrono::collision::ChCollisionModel> *)(this_00 + 0x198))->
                   super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          p_Var13 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x1a0))->_M_pi;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
            }
          }
          (*peVar6->_vptr_ChCollisionModel[3])();
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          peVar6 = (((shared_ptr<chrono::collision::ChCollisionModel> *)(this_00 + 0x198))->
                   super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          p_Var13 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x1a0))->_M_pi;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
            }
          }
          local_3b8 = (local_350->
                      super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
          local_3b0 = (local_350->
                      super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
          if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_3b0->_M_use_count = local_3b0->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_3b0->_M_use_count = local_3b0->_M_use_count + 1;
            }
          }
          ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_1b8,local_408);
          (*peVar6->_vptr_ChCollisionModel[0xf])
                    (peVar6,&local_3b8,&local_448,local_410,(ChMatrix33<double> *)local_1b8);
          if (local_3b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0);
          }
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          peVar6 = (((shared_ptr<chrono::collision::ChCollisionModel> *)(this_00 + 0x198))->
                   super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          p_Var13 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this_00 + 0x1a0))->_M_pi;
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
            }
          }
          (*peVar6->_vptr_ChCollisionModel[4])();
          if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          }
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          this_02 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&pCStack_1a8,(local_358->_M_dataplus)._M_p,
                               local_358->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(this_02,"_",1);
          std::ostream::operator<<(this_02,iVar11);
          p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
          p_Var13->_M_use_count = 1;
          p_Var13->_M_weak_count = 1;
          p_Var13->_vptr__Sp_counted_base = local_378;
          local_3c8.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)(p_Var13 + 1);
          p_Var13[1]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var13[1]._M_use_count = 0;
          p_Var13[1]._M_weak_count = 0;
          p_Var13[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var13[2]._M_use_count = 0;
          p_Var13[2]._M_weak_count = 0;
          p_Var13[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var13[2]._M_use_count = 0;
          p_Var13[2]._M_weak_count = 0;
          p_Var13[3]._vptr__Sp_counted_base = (_func_int **)0x0;
          p_Var13[3]._M_use_count = 0;
          p_Var13[3]._M_weak_count = 0;
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var13->_M_use_count = 2;
          }
          model = &local_3c8;
          local_3c8.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Var13;
          ChPhysicsItem::AddVisualModel((ChPhysicsItem *)this_00,model);
          if (local_3c8.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_3c8.
                       super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          pCVar14 = (ChTriangleMeshShape *)
                    ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)model);
          ChTriangleMeshShape::ChTriangleMeshShape(pCVar14);
          local_430 = pCVar14;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::ChTriangleMeshShape*>(&local_428,pCVar14);
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
          local_3d8.
          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (ChTriangleMeshConnected *)(this_01 + 1);
          local_3d8.
          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = this_01;
          ChTriangleMeshShape::SetMesh(local_430,&local_3d8,true);
          if (local_3d8.
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_3d8.
                       super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          pCVar14 = local_430;
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&pCVar14->name);
          if ((ChVector<double> *)local_338._16_8_ != &CStack_318) {
            operator_delete((void *)local_338._16_8_,
                            (ulong)((long)(double *)CStack_318.m_data[0] + 1));
          }
          ChPhysicsItem::GetVisualModel((ChPhysicsItem *)this_00);
          this = local_348;
          local_3e8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_430->super_ChVisualShape;
          local_3e8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = local_428._M_pi;
          if (local_428._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_428._M_pi)->_M_use_count = (local_428._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_428._M_pi)->_M_use_count = (local_428._M_pi)->_M_use_count + 1;
            }
          }
          local_220.m_data[0] = 1.0;
          local_220.m_data[3] = 0.0;
          local_220.m_data[1] = 0.0;
          local_220.m_data[2] = 0.0;
          local_338._16_8_ = local_380;
          CStack_318.m_data[1] = 0.0;
          local_320 = (pointer)0x0;
          CStack_318.m_data[0] = 0.0;
          CStack_318.m_data[2] = 1.0;
          local_2f0 = (pointer)0x0;
          local_300 = (pointer)0x0;
          pCStack_2f8 = (pointer)0x0;
          ChMatrix33<double>::ChMatrix33(&local_2e8,&local_220);
          ChVisualModel::AddShape(this,&local_3e8,(ChFrame<double> *)(local_338 + 0x10));
          if (local_3e8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_3e8.
                       super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_340 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_340);
          }
          local_338._16_8_ =
               local_388 *
               local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0] * local_360;
          local_320 = (pointer)(local_388 *
                                local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[4] * local_360);
          CStack_318.m_data[0] =
               local_388 *
               local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8] * local_360;
          ChBody::SetInertiaXX((ChBody *)this_00,(ChVector<double> *)(local_338 + 0x10));
          local_3f8._vptr_ChGeometry = (_func_int **)this_00;
          local_3f0 = local_458;
          if (local_458 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)local_458 + 8) = *(_Atomic_word *)((long)local_458 + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)local_458 + 8) = *(_Atomic_word *)((long)local_458 + 8) + 1;
            }
          }
          (*(local_400->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x25])
                    (local_400,&local_3f8);
          if (local_3f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f0);
          }
          if (local_428._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_428._M_pi);
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base((ios_base *)&pCStack_138);
          if (local_448 != (void *)0x0) {
            operator_delete(local_448,local_438 - (long)local_448);
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          if (cVar9 == '\0') goto LAB_0093de08;
          iVar11 = iVar11 + 1;
          p_Var13 = local_458;
        } while (iVar11 != local_414);
        bVar17 = true;
      }
    }
LAB_0093de0f:
    if (local_458 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458);
    }
    collision::ChConvexDecompositionHACDv2::~ChConvexDecompositionHACDv2(&local_2a0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._8_8_);
  }
  return bVar17;
}

Assistant:

bool AddTriangleMeshConvexDecompositionSplit(ChSystem* system,
                                             std::shared_ptr<ChMaterialSurface> material,
                                             const std::string& obj_filename,
                                             const std::string& name,
                                             const ChVector<>& pos,
                                             const ChQuaternion<>& rot,
                                             double total_mass) {
    assert(material->GetContactMethod() == system->GetContactMethod());

    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(obj_filename, true, false);
    if (!trimesh)
        return false;

    for (int i = 0; i < trimesh->m_vertices.size(); i++) {
        trimesh->m_vertices[i] = pos + rot.Rotate(trimesh->m_vertices[i]);
    }
    collision::ChConvexDecompositionHACDv2 mydecompositionHACDv2;

    int hacd_maxhullcount = 1024;
    int hacd_maxhullmerge = 256;
    int hacd_maxhullvertexes = 64;
    double hacd_concavity = 0.01;
    double hacd_smallclusterthreshold = 0.1;
    double hacd_fusetolerance = 1e-6;

    mydecompositionHACDv2.Reset();
    mydecompositionHACDv2.AddTriangleMesh(*trimesh);

    mydecompositionHACDv2.SetParameters(hacd_maxhullcount, hacd_maxhullmerge, hacd_maxhullvertexes,
                                        (float)hacd_concavity, (float)hacd_smallclusterthreshold,
                                        (float)hacd_fusetolerance);
    mydecompositionHACDv2.ComputeConvexDecomposition();
    collision::ChConvexDecomposition* used_decomposition = &mydecompositionHACDv2;

    int hull_count = used_decomposition->GetHullCount();

    std::shared_ptr<ChBody> body;
    double mass;
    ChVector<> center;
    ChMatrix33<> inertia;
    double sum = 0;
    for (int c = 0; c < hull_count; c++) {
        geometry::ChTriangleMeshConnected trimesh_convex;
        if (!used_decomposition->GetConvexHullResult(c, trimesh_convex))
            return false;
        trimesh_convex.ComputeMassProperties(true, mass, center, inertia);
        sum += mass;
    }

    double scale = 1.0 / sum;

    for (int c = 0; c < hull_count; c++) {
        auto trimesh_convex = chrono_types::make_shared<geometry::ChTriangleMeshConnected>();
        if (!used_decomposition->GetConvexHullResult(c, *trimesh_convex))
            return false;
        trimesh_convex->ComputeMassProperties(true, mass, center, inertia);

        body = std::shared_ptr<ChBody>(system->NewBody());
        body->SetMass(mass);
        body->SetPos(pos);
        body->SetRot(rot);
        body->SetCollide(true);
        body->SetBodyFixed(false);

        std::vector<ChVector<double>> convexhull;
        if (!used_decomposition->GetConvexHullResult(c, convexhull))
            return false;
        for (size_t v = 0; v < convexhull.size(); v++) {
            convexhull[v] = convexhull[v] - center;
        }

        body->GetCollisionModel()->ClearModel();
        body->GetCollisionModel()->AddConvexHull(material, convexhull, pos, rot);
        body->GetCollisionModel()->BuildModel();

        std::stringstream ss;
        ss << name << "_" << c;
        //      geometry::ChTriangleMeshConnected trimesh_convex;
        //      used_decomposition->GetConvexHullResult(c, trimesh_convex);

        auto model = chrono_types::make_shared<ChVisualModel>();
        body->AddVisualModel(model);

        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh_convex);
        trimesh_shape->SetName(ss.str());
        body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());

        // std::cout << mass << " " << scale * mass* total_mass << " " <<
        // inertia(0, 0) << " " << inertia(1, 1) << " " << inertia(2, 2) << std::endl;
        body->SetInertiaXX(ChVector<>(inertia(0, 0) * scale * total_mass, inertia(1, 1) * scale * total_mass,
                                      inertia(2, 2) * scale * total_mass));

        system->AddBody(body);
    }

    return true;
}